

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmCaseInsensitiveDirectoryListGenerator *gen)

{
  bool bVar1;
  string path;
  string local_70;
  string local_50;
  
  gen->Loaded = false;
  anon_unknown.dwarf_86e7a3::cmCaseInsensitiveDirectoryListGenerator::GetNextCandidate
            (&local_70,gen,startPath);
  if ((string *)local_70._M_string_length == (string *)0x0) {
    bVar1 = false;
  }
  else {
    do {
      bVar1 = TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&>
                        ((_anonymous_namespace_ *)filesCollector,
                         (anon_class_8_1_8991fb9c *)local_70._M_dataplus._M_p,
                         (string *)local_70._M_string_length);
      if (bVar1) break;
      anon_unknown.dwarf_86e7a3::cmCaseInsensitiveDirectoryListGenerator::GetNextCandidate
                (&local_50,gen,startPath);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while ((string *)local_70._M_string_length != (string *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}